

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O2

int yaml_parser_fetch_more_tokens(yaml_parser_t *parser)

{
  int iVar1;
  yaml_simple_key_t *pyVar2;
  
  do {
    if ((parser->tokens).head != (parser->tokens).tail) {
      iVar1 = yaml_parser_stale_simple_keys(parser);
      if (iVar1 == 0) {
        return 0;
      }
      pyVar2 = (parser->simple_keys).start;
      while( true ) {
        if (pyVar2 == (parser->simple_keys).top) {
          parser->token_available = 1;
          return 1;
        }
        if ((pyVar2->possible != 0) && (pyVar2->token_number == parser->tokens_parsed)) break;
        pyVar2 = pyVar2 + 1;
      }
    }
    iVar1 = yaml_parser_fetch_next_token(parser);
  } while (iVar1 != 0);
  return 0;
}

Assistant:

YAML_DECLARE(int)
yaml_parser_fetch_more_tokens(yaml_parser_t *parser)
{
    int need_more_tokens;

    /* While we need more tokens to fetch, do it. */

    while (1)
    {
        /*
         * Check if we really need to fetch more tokens.
         */

        need_more_tokens = 0;

        if (parser->tokens.head == parser->tokens.tail)
        {
            /* Queue is empty. */

            need_more_tokens = 1;
        }
        else
        {
            yaml_simple_key_t *simple_key;

            /* Check if any potential simple key may occupy the head position. */

            if (!yaml_parser_stale_simple_keys(parser))
                return 0;

            for (simple_key = parser->simple_keys.start;
                    simple_key != parser->simple_keys.top; simple_key++) {
                if (simple_key->possible
                        && simple_key->token_number == parser->tokens_parsed) {
                    need_more_tokens = 1;
                    break;
                }
            }
        }

        /* We are finished. */

        if (!need_more_tokens)
            break;

        /* Fetch the next token. */

        if (!yaml_parser_fetch_next_token(parser))
            return 0;
    }

    parser->token_available = 1;

    return 1;
}